

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall kj::Exception::Context::Context(Context *this,Context *other)

{
  RefOrVoid<const_kj::Exception::Context> orig;
  String *in_RDX;
  Own<kj::Exception::Context> local_40;
  Maybe<kj::Own<kj::Exception::Context>_> local_30;
  Own<kj::Exception::Context> *local_20;
  Own<kj::Exception::Context> *n;
  Context *other_local;
  Context *this_local;
  
  this->file = other->file;
  this->line = other->line;
  n = (Own<kj::Exception::Context> *)other;
  other_local = this;
  str<kj::String_const&>(&this->description,(kj *)&other->description,in_RDX);
  Maybe<kj::Own<kj::Exception::Context>_>::Maybe(&this->next);
  local_20 = kj::_::readMaybe<kj::Exception::Context>
                       ((Maybe<kj::Own<kj::Exception::Context>_> *)&n[2].ptr);
  if (local_20 != (Own<kj::Exception::Context> *)0x0) {
    orig = Own<kj::Exception::Context>::operator*(local_20);
    heap<kj::Exception::Context_const&>((kj *)&local_40,orig);
    Maybe<kj::Own<kj::Exception::Context>_>::Maybe(&local_30,&local_40);
    Maybe<kj::Own<kj::Exception::Context>_>::operator=(&this->next,&local_30);
    Maybe<kj::Own<kj::Exception::Context>_>::~Maybe(&local_30);
    Own<kj::Exception::Context>::~Own(&local_40);
  }
  return;
}

Assistant:

Exception::Context::Context(const Context& other) noexcept
    : file(other.file), line(other.line), description(str(other.description)) {
  KJ_IF_MAYBE(n, other.next) {
    next = heap(**n);
  }
}